

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node256_leaf.cpp
# Opt level: O1

bool __thiscall duckdb::Node256Leaf::GetNextByte(Node256Leaf *this,uint8_t *byte)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar1 = (ulong)*byte;
  if ((this->mask[*byte >> 6] >> (uVar1 & 0x3f) & 1) == 0) {
    do {
      uVar2 = uVar1;
      if (uVar2 == 0xff) {
        return uVar2 < 0xff;
      }
      uVar1 = uVar2 + 1;
    } while ((this->mask[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) == 0);
    bVar3 = uVar2 < 0xff;
  }
  else {
    bVar3 = true;
  }
  *byte = (uint8_t)uVar1;
  return bVar3;
}

Assistant:

bool Node256Leaf::GetNextByte(uint8_t &byte) {
	ValidityMask v_mask(&mask[0], Node256::CAPACITY);
	for (uint16_t i = byte; i < CAPACITY; i++) {
		if (v_mask.RowIsValid(i)) {
			byte = UnsafeNumericCast<uint8_t>(i);
			return true;
		}
	}
	return false;
}